

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen_helpers.hpp
# Opt level: O0

bool ear::doIntersect<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>>
               (_Rb_tree_const_iterator<int> first1,_Rb_tree_const_iterator<int> last1,
               _Rb_tree_const_iterator<int> first2,_Rb_tree_const_iterator<int> last2)

{
  int iVar1;
  bool bVar2;
  reference piVar3;
  bool local_31;
  _Self local_30;
  _Rb_tree_const_iterator<int> last2_local;
  _Rb_tree_const_iterator<int> first2_local;
  _Rb_tree_const_iterator<int> last1_local;
  _Rb_tree_const_iterator<int> first1_local;
  
  local_30._M_node = last2._M_node;
  last2_local._M_node = first2._M_node;
  first2_local._M_node = last1._M_node;
  last1_local._M_node = first1._M_node;
  while( true ) {
    bVar2 = std::operator!=(&last1_local,&first2_local);
    local_31 = false;
    if (bVar2) {
      local_31 = std::operator!=(&last2_local,&local_30);
    }
    if (local_31 == false) break;
    piVar3 = std::_Rb_tree_const_iterator<int>::operator*(&last1_local);
    iVar1 = *piVar3;
    piVar3 = std::_Rb_tree_const_iterator<int>::operator*(&last2_local);
    if (iVar1 < *piVar3) {
      std::_Rb_tree_const_iterator<int>::operator++(&last1_local);
    }
    else {
      piVar3 = std::_Rb_tree_const_iterator<int>::operator*(&last2_local);
      iVar1 = *piVar3;
      piVar3 = std::_Rb_tree_const_iterator<int>::operator*(&last1_local);
      if (*piVar3 <= iVar1) {
        return true;
      }
      std::_Rb_tree_const_iterator<int>::operator++(&last2_local);
    }
  }
  return false;
}

Assistant:

bool doIntersect(InputIterator1 first1, InputIterator1 last1,
                   InputIterator2 first2, InputIterator2 last2) {
    while (first1 != last1 && first2 != last2) {
      if (*first1 < *first2)
        ++first1;
      else if (*first2 < *first1)
        ++first2;
      else {
        return true;
      }
    }
    return false;
  }